

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O3

void slang::ast::SemanticFacts::populateTimeScale
               (optional<slang::TimeScale> *timeScale,Scope *scope,
               optional<slang::TimeScale> directiveTimeScale,optional<slang::SourceRange> unitsRange
               ,optional<slang::SourceRange> precisionRange)

{
  bool bVar1;
  strong_ordering sVar2;
  TimeScaleValue TVar3;
  optional<slang::TimeScale> oVar4;
  Diagnostic *this;
  SourceRange *pSVar6;
  string local_48;
  ulong uVar5;
  
  bVar1 = unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::SourceRange>._M_engaged;
  uVar5 = (ulong)(uint5)directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>.
                        _M_payload.super__Optional_payload_base<slang::TimeScale>;
  pSVar6 = (SourceRange *)&precisionRange;
  if ((unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
       super__Optional_payload_base<slang::SourceRange>._M_engaged == true) &&
     (precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged != false)) {
    return;
  }
  if ((scope->thisSym->kind == CompilationUnit) &&
     (((uint5)directiveTimeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale> & 0x100000000) != 0)) {
LAB_0033c462:
    TVar3 = SUB82(uVar5 >> 0x10,0);
    if ((timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
      (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload =
           (_Storage<slang::TimeScale,_true>)0x1030103;
      (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
    }
  }
  else {
    oVar4 = Scope::getTimeScale(scope);
    uVar5 = (ulong)(uint5)oVar4.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::TimeScale>;
    if (((uint5)oVar4.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale> & 0x100000000) != 0)
    goto LAB_0033c462;
    TVar3.unit = Nanoseconds;
    TVar3.magnitude = One;
    uVar5 = 0x103;
    if ((timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
      return;
    }
  }
  if (bVar1 == false) {
    (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
    super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.base = SUB82(uVar5,0);
    if (precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged == false) {
      (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.precision = TVar3;
      return;
    }
  }
  else if (precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_engaged == false) {
    (timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
    super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.precision = TVar3;
    sVar2 = TimeScaleValue::operator<=>
                      (&(timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
                        super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.precision
                       ,(TimeScaleValue *)timeScale);
    if (sVar2._M_value < '\x01') {
      return;
    }
    pSVar6 = (SourceRange *)&unitsRange;
    goto LAB_0033c4b8;
  }
  sVar2 = TimeScaleValue::operator<=>
                    (&(timeScale->super__Optional_base<slang::TimeScale,_true,_true>)._M_payload.
                      super__Optional_payload_base<slang::TimeScale>._M_payload._M_value.precision,
                     (TimeScaleValue *)timeScale);
  if (sVar2._M_value < '\x01') {
    return;
  }
LAB_0033c4b8:
  this = Scope::addDiag(scope,(DiagCode)0xb0004,*pSVar6);
  TimeScale::toString_abi_cxx11_(&local_48,(TimeScale *)timeScale);
  Diagnostic::operator<<(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SemanticFacts::populateTimeScale(std::optional<TimeScale>& timeScale, const Scope& scope,
                                      std::optional<TimeScale> directiveTimeScale,
                                      std::optional<SourceRange> unitsRange,
                                      std::optional<SourceRange> precisionRange) {
    // If no time unit was set, infer one based on the following rules:
    // - If the scope is nested (inside another definition), inherit from that definition.
    // - Otherwise use a `timescale directive if there is one.
    // - Otherwise, look for a time unit in the compilation scope.
    // - Finally use the compilation default.
    if (unitsRange && precisionRange)
        return;

    std::optional<TimeScale> ts;
    if (scope.asSymbol().kind == SymbolKind::CompilationUnit)
        ts = directiveTimeScale;

    if (!ts)
        ts = scope.getTimeScale();

    if (!ts) {
        // If the scope didn't have any portion of the timescale set yet,
        // then we'll just let it remain nullopt so clients know that we
        // are using the default. Otherwise we should use the built-in
        // default for the unset portion.
        if (!timeScale)
            return;

        // Defaults to 1ns/1ns
        ts.emplace();
    }
    else if (!timeScale) {
        timeScale.emplace();
    }

    if (!unitsRange)
        timeScale->base = ts->base;
    if (!precisionRange)
        timeScale->precision = ts->precision;

    if ((unitsRange || precisionRange) && timeScale->precision > timeScale->base) {
        auto range = precisionRange ? *precisionRange : *unitsRange;
        auto& diag = scope.addDiag(diag::InvalidInferredTimeScale, range);
        diag << timeScale->toString();
    }
}